

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O0

bool tinyusdz::prim::ReconstructPrim<tinyusdz::DiskLight>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,DiskLight *light,
               string *warn,string *err,PrimReconstructOptions *options)

{
  bool bVar1;
  __type _Var2;
  Property *pPVar3;
  Attribute *this;
  AttrMeta *pAVar4;
  AttrMeta *pAVar5;
  size_type sVar6;
  mapped_type *this_00;
  ostream *poVar7;
  string *name;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar8;
  bool local_db9;
  bool local_d91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d68 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d48 [32];
  string local_d28 [32];
  ostringstream local_d08 [8];
  ostringstream ss_w_2;
  allocator local_b69;
  undefined1 local_b68 [71];
  allocator local_b21;
  string local_b20;
  undefined1 local_b00 [8];
  function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  fun_1;
  Attribute *attr_2;
  allocator local_ac1;
  undefined1 local_ac0 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a80 [32];
  ostringstream local_a60 [8];
  ostringstream ss_w_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8e8;
  string local_8c8;
  allocator local_8a1;
  undefined1 local_8a0 [56];
  undefined1 local_868 [71];
  allocator local_821;
  string local_820;
  undefined1 local_800 [8];
  function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  fun;
  Attribute *attr_1;
  allocator local_7c1;
  undefined1 local_7c0 [40];
  Attribute *attr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_778 [32];
  ostringstream local_758 [8];
  ostringstream ss_w;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e0;
  string local_5c0;
  allocator local_599;
  string local_598 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_578 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_558 [39];
  allocator local_531;
  string local_530 [32];
  fmt local_510 [32];
  ostringstream local_4f0 [8];
  ostringstream ss_e_1;
  allocator local_371;
  string local_370;
  string local_350;
  undefined1 local_330 [8];
  ParseResult ret_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8 [39];
  allocator local_2c1;
  string local_2c0 [32];
  string local_2a0;
  ostringstream local_280 [8];
  ostringstream ss_e;
  allocator local_101;
  string local_100;
  string local_e0;
  undefined1 local_c0 [8];
  ParseResult ret;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>
  *prop;
  const_iterator __end2;
  const_iterator __begin2;
  PropertyMap *__range2;
  undefined1 local_70 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  string *err_local;
  string *warn_local;
  DiskLight *light_local;
  ReferenceList *references_local;
  PropertyMap *properties_local;
  Specifier *spec_local;
  
  table._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)err;
  ::std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_70);
  bVar1 = ReconstructXformOpsFromProperties
                    (spec,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_70,properties,
                     (vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *)light,
                     (string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if (bVar1) {
    __end2 = ::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
             ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                      *)properties);
    prop = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>
            *)::std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
              ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                     *)properties);
    while (bVar1 = ::std::operator!=(&__end2,(_Self *)&prop), bVar1) {
      ret.err.field_2._8_8_ =
           ::std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>
           ::operator*(&__end2);
      ::std::__cxx11::string::string((string *)&local_e0,(string *)ret.err.field_2._8_8_);
      pPVar3 = (Property *)(ret.err.field_2._8_8_ + 0x20);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_100,"inputs:radius",&local_101);
      name = &local_100;
      anon_unknown_0::ParseTypedAttribute<float>
                ((ParseResult *)local_c0,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_70,&local_e0,pPVar3,name,&light->radius);
      ::std::__cxx11::string::~string((string *)&local_100);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_101);
      ::std::__cxx11::string::~string((string *)&local_e0);
      if ((local_c0._0_4_ == Success) || (local_c0._0_4_ == AlreadyProcessed)) {
        __range2._4_4_ = 3;
      }
      else if (local_c0._0_4_ == Unmatched) {
        __range2._4_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_280);
        poVar7 = ::std::operator<<((ostream *)local_280,"[error]");
        poVar7 = ::std::operator<<(poVar7,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar7 = ::std::operator<<(poVar7,":");
        poVar7 = ::std::operator<<(poVar7,"ReconstructPrim");
        poVar7 = ::std::operator<<(poVar7,"():");
        poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xcd9);
        ::std::operator<<(poVar7," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_2c0,"Parsing attribute `{}` failed. Error: {}",&local_2c1);
        fmt::format<char[14],std::__cxx11::string>
                  (&local_2a0,(fmt *)local_2c0,(string *)"inputs:radius",(char (*) [14])&ret,name);
        poVar7 = ::std::operator<<((ostream *)local_280,(string *)&local_2a0);
        ::std::operator<<(poVar7,"\n");
        ::std::__cxx11::string::~string((string *)&local_2a0);
        ::std::__cxx11::string::~string(local_2c0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
        if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
          ::std::__cxx11::ostringstream::str();
          ::std::operator+(local_2e8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (ret_1.err.field_2._M_local_buf + 8));
          ::std::__cxx11::string::operator=
                    ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (string *)local_2e8);
          ::std::__cxx11::string::~string((string *)local_2e8);
          ::std::__cxx11::string::~string((string *)(ret_1.err.field_2._M_local_buf + 8));
        }
        spec_local._7_1_ = 0;
        __range2._4_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_280);
      }
      anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_c0);
      if (__range2._4_4_ == 0) {
        ::std::__cxx11::string::string((string *)&local_350,(string *)ret.err.field_2._8_8_);
        pPVar3 = (Property *)(ret.err.field_2._8_8_ + 0x20);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_370,"extent",&local_371);
        anon_unknown_0::ParseExtentAttribute
                  ((ParseResult *)local_330,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_70,&local_350,pPVar3,&local_370,&(light->super_BoundableLight).extent);
        ::std::__cxx11::string::~string((string *)&local_370);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_371);
        ::std::__cxx11::string::~string((string *)&local_350);
        if ((local_330._0_4_ == Success) || (local_330._0_4_ == AlreadyProcessed)) {
          __range2._4_4_ = 3;
        }
        else if (local_330._0_4_ == Unmatched) {
          __range2._4_4_ = 0;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_4f0);
          poVar7 = ::std::operator<<((ostream *)local_4f0,"[error]");
          poVar7 = ::std::operator<<(poVar7,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar7 = ::std::operator<<(poVar7,":");
          poVar7 = ::std::operator<<(poVar7,"ReconstructPrim");
          poVar7 = ::std::operator<<(poVar7,"():");
          poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xcda);
          ::std::operator<<(poVar7," ");
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_530,"Parsing attribute `extent` failed. Error: {}",&local_531);
          fmt::format<std::__cxx11::string>
                    (local_510,(string *)local_530,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ret_1);
          poVar7 = ::std::operator<<((ostream *)local_4f0,(string *)local_510);
          ::std::operator<<(poVar7,"\n");
          ::std::__cxx11::string::~string((string *)local_510);
          ::std::__cxx11::string::~string(local_530);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_531);
          if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
            ::std::__cxx11::ostringstream::str();
            ::std::operator+(local_558,local_578);
            ::std::__cxx11::string::operator=
                      ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (string *)local_558);
            ::std::__cxx11::string::~string((string *)local_558);
            ::std::__cxx11::string::~string((string *)local_578);
          }
          spec_local._7_1_ = 0;
          __range2._4_4_ = 1;
          ::std::__cxx11::ostringstream::~ostringstream(local_4f0);
        }
        anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_330);
        if (__range2._4_4_ != 0) goto joined_r0x002b94cc;
        bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)ret.err.field_2._8_8_,"visibility");
        if (bVar1) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_598,"visibility",&local_599);
          sVar6 = ::std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_70,(key_type *)local_598);
          ::std::__cxx11::string::~string(local_598);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_599);
          if (sVar6 == 0) {
            Property::value_type_name_abi_cxx11_
                      (&local_5c0,(Property *)(ret.err.field_2._8_8_ + 0x20));
            tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
            _Var2 = ::std::operator==(&local_5c0,&local_5e0);
            local_d91 = false;
            if (_Var2) {
              bVar1 = Property::is_attribute((Property *)(ret.err.field_2._8_8_ + 0x20));
              local_d91 = false;
              if (bVar1) {
                local_d91 = Property::is_empty((Property *)(ret.err.field_2._8_8_ + 0x20));
              }
            }
            ::std::__cxx11::string::~string((string *)&local_5e0);
            ::std::__cxx11::string::~string((string *)&local_5c0);
            if (local_d91 == false) {
              fun._M_invoker =
                   (_Invoker_type)
                   Property::get_attribute((Property *)(ret.err.field_2._8_8_ + 0x20));
              ::std::
              function<nonstd::expected_lite::expected<tinyusdz::Visibility,std::__cxx11::string>(std::__cxx11::string_const&)>
              ::
              function<nonstd::expected_lite::expected<tinyusdz::Visibility,std::__cxx11::string>(&)(std::__cxx11::string_const&),void>
                        ((function<nonstd::expected_lite::expected<tinyusdz::Visibility,std::__cxx11::string>(std::__cxx11::string_const&)>
                          *)local_800,VisibilityEnumHandler);
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string((string *)&local_820,"visibility",&local_821);
              bVar1 = options->strict_allowedToken_check;
              ::std::
              function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              ::function((function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          *)(local_868 + 0x20),
                         (function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          *)local_800);
              bVar1 = ParseTimeSampledEnumProperty<tinyusdz::Visibility,tinyusdz::Visibility>
                                (&local_820,(bool)(bVar1 & 1),
                                 (EnumHandlerFun<tinyusdz::Visibility> *)(local_868 + 0x20),
                                 (Attribute *)fun._M_invoker,
                                 &(light->super_BoundableLight).visibility,warn,
                                 (string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count);
              ::std::
              function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              ::~function((function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                           *)(local_868 + 0x20));
              ::std::__cxx11::string::~string((string *)&local_820);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_821);
              if (((bVar1 ^ 0xffU) & 1) == 0) {
                pAVar4 = Attribute::metas((Attribute *)fun._M_invoker);
                pAVar5 = TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_>::
                         metas(&(light->super_BoundableLight).visibility);
                AttrMetas::operator=(pAVar5,pAVar4);
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          ((string *)local_868,"visibility",(allocator *)(local_8a0 + 0x37));
                pVar8 = ::std::
                        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_70,(value_type *)local_868);
                local_8a0._32_8_ = pVar8.first._M_node;
                local_8a0[0x28] = pVar8.second;
                ::std::__cxx11::string::~string((string *)local_868);
                ::std::allocator<char>::~allocator((allocator<char> *)(local_8a0 + 0x37));
                __range2._4_4_ = 3;
              }
              else {
                spec_local._7_1_ = 0;
                __range2._4_4_ = 1;
              }
              ::std::
              function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              ::~function((function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                           *)local_800);
              goto joined_r0x002b94cc;
            }
            ::std::__cxx11::ostringstream::ostringstream(local_758);
            poVar7 = ::std::operator<<((ostream *)local_758,"[warn]");
            poVar7 = ::std::operator<<(poVar7,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar7 = ::std::operator<<(poVar7,":");
            poVar7 = ::std::operator<<(poVar7,"ReconstructPrim");
            poVar7 = ::std::operator<<(poVar7,"():");
            poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xcdc);
            ::std::operator<<(poVar7," ");
            poVar7 = ::std::operator<<((ostream *)local_758,"No value assigned to `");
            poVar7 = ::std::operator<<(poVar7,"visibility");
            poVar7 = ::std::operator<<(poVar7,"` token attribute. Set default token value.");
            ::std::operator<<(poVar7,"\n");
            if (warn != (string *)0x0) {
              ::std::__cxx11::ostringstream::str();
              ::std::operator+(local_778,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &attr);
              ::std::__cxx11::string::operator=((string *)warn,(string *)local_778);
              ::std::__cxx11::string::~string((string *)local_778);
              ::std::__cxx11::string::~string((string *)&attr);
            }
            ::std::__cxx11::ostringstream::~ostringstream(local_758);
            local_7c0._32_8_ = Property::get_attribute((Property *)(ret.err.field_2._8_8_ + 0x20));
            pAVar4 = Attribute::metas((Attribute *)local_7c0._32_8_);
            pAVar5 = TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_>::metas
                               (&(light->super_BoundableLight).visibility);
            AttrMetas::operator=(pAVar5,pAVar4);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string((string *)local_7c0,"visibility",&local_7c1);
            ::std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_70,(value_type *)local_7c0);
            ::std::__cxx11::string::~string((string *)local_7c0);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_7c1);
          }
        }
        else {
          bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)ret.err.field_2._8_8_,"purpose");
          if (bVar1) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string((string *)local_8a0,"purpose",&local_8a1);
            sVar6 = ::std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_70,(key_type *)local_8a0);
            ::std::__cxx11::string::~string((string *)local_8a0);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_8a1);
            if (sVar6 == 0) {
              Property::value_type_name_abi_cxx11_
                        (&local_8c8,(Property *)(ret.err.field_2._8_8_ + 0x20));
              tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
              _Var2 = ::std::operator==(&local_8c8,&local_8e8);
              local_db9 = false;
              if (_Var2) {
                bVar1 = Property::is_attribute((Property *)(ret.err.field_2._8_8_ + 0x20));
                local_db9 = false;
                if (bVar1) {
                  local_db9 = Property::is_empty((Property *)(ret.err.field_2._8_8_ + 0x20));
                }
              }
              ::std::__cxx11::string::~string((string *)&local_8e8);
              ::std::__cxx11::string::~string((string *)&local_8c8);
              if (local_db9 == false) {
                fun_1._M_invoker =
                     (_Invoker_type)
                     Property::get_attribute((Property *)(ret.err.field_2._8_8_ + 0x20));
                ::std::
                function<nonstd::expected_lite::expected<tinyusdz::Purpose,std::__cxx11::string>(std::__cxx11::string_const&)>
                ::
                function<nonstd::expected_lite::expected<tinyusdz::Purpose,std::__cxx11::string>(&)(std::__cxx11::string_const&),void>
                          ((function<nonstd::expected_lite::expected<tinyusdz::Purpose,std::__cxx11::string>(std::__cxx11::string_const&)>
                            *)local_b00,PurposeEnumHandler);
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string((string *)&local_b20,"purpose",&local_b21);
                bVar1 = options->strict_allowedToken_check;
                ::std::
                function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                ::function((function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                            *)(local_b68 + 0x20),
                           (function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                            *)local_b00);
                bVar1 = ParseUniformEnumProperty<tinyusdz::Purpose,tinyusdz::Purpose>
                                  (&local_b20,(bool)(bVar1 & 1),
                                   (EnumHandlerFun<tinyusdz::Purpose> *)(local_b68 + 0x20),
                                   (Attribute *)fun_1._M_invoker,
                                   &(light->super_BoundableLight).purpose,warn,
                                   (string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count)
                ;
                ::std::
                function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                ::~function((function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                             *)(local_b68 + 0x20));
                ::std::__cxx11::string::~string((string *)&local_b20);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_b21);
                if (((bVar1 ^ 0xffU) & 1) == 0) {
                  pAVar4 = Attribute::metas((Attribute *)fun_1._M_invoker);
                  pAVar5 = TypedAttributeWithFallback<tinyusdz::Purpose>::metas
                                     (&(light->super_BoundableLight).purpose);
                  AttrMetas::operator=(pAVar5,pAVar4);
                  ::std::allocator<char>::allocator();
                  ::std::__cxx11::string::string((string *)local_b68,"purpose",&local_b69);
                  ::std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_70,(value_type *)local_b68);
                  ::std::__cxx11::string::~string((string *)local_b68);
                  ::std::allocator<char>::~allocator((allocator<char> *)&local_b69);
                  __range2._4_4_ = 3;
                }
                else {
                  spec_local._7_1_ = 0;
                  __range2._4_4_ = 1;
                }
                ::std::
                function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                ::~function((function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                             *)local_b00);
                goto joined_r0x002b94cc;
              }
              ::std::__cxx11::ostringstream::ostringstream(local_a60);
              poVar7 = ::std::operator<<((ostream *)local_a60,"[warn]");
              poVar7 = ::std::operator<<(poVar7,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                        );
              poVar7 = ::std::operator<<(poVar7,":");
              poVar7 = ::std::operator<<(poVar7,"ReconstructPrim");
              poVar7 = ::std::operator<<(poVar7,"():");
              poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xcde);
              ::std::operator<<(poVar7," ");
              poVar7 = ::std::operator<<((ostream *)local_a60,"No value assigned to `");
              poVar7 = ::std::operator<<(poVar7,"purpose");
              poVar7 = ::std::operator<<(poVar7,"` token attribute. Set default token value.");
              ::std::operator<<(poVar7,"\n");
              if (warn != (string *)0x0) {
                ::std::__cxx11::ostringstream::str();
                ::std::operator+(local_a80,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(local_ac0 + 0x20));
                ::std::__cxx11::string::operator=((string *)warn,(string *)local_a80);
                ::std::__cxx11::string::~string((string *)local_a80);
                ::std::__cxx11::string::~string((string *)(local_ac0 + 0x20));
              }
              ::std::__cxx11::ostringstream::~ostringstream(local_a60);
              this = Property::get_attribute((Property *)(ret.err.field_2._8_8_ + 0x20));
              pAVar4 = Attribute::metas(this);
              pAVar5 = TypedAttributeWithFallback<tinyusdz::Purpose>::metas
                                 (&(light->super_BoundableLight).purpose);
              AttrMetas::operator=(pAVar5,pAVar4);
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string((string *)local_ac0,"purpose",&local_ac1);
              ::std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_70,(value_type *)local_ac0);
              ::std::__cxx11::string::~string((string *)local_ac0);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_ac1);
            }
          }
          else {
            sVar6 = ::std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_70,(key_type *)ret.err.field_2._8_8_);
            if (sVar6 == 0) {
              pPVar3 = (Property *)(ret.err.field_2._8_8_ + 0x20);
              this_00 = ::std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                                      *)&(light->super_BoundableLight).props,
                                     (key_type *)ret.err.field_2._8_8_);
              Property::operator=(this_00,pPVar3);
              ::std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_70,(value_type *)ret.err.field_2._8_8_);
            }
            sVar6 = ::std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_70,(key_type *)ret.err.field_2._8_8_);
            if (sVar6 == 0) {
              ::std::__cxx11::ostringstream::ostringstream(local_d08);
              poVar7 = ::std::operator<<((ostream *)local_d08,"[warn]");
              poVar7 = ::std::operator<<(poVar7,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                        );
              poVar7 = ::std::operator<<(poVar7,":");
              poVar7 = ::std::operator<<(poVar7,"ReconstructPrim");
              poVar7 = ::std::operator<<(poVar7,"():");
              poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xce0);
              ::std::operator<<(poVar7," ");
              ::std::operator+((char *)local_d28,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               "Unsupported/unimplemented property: ");
              poVar7 = ::std::operator<<((ostream *)local_d08,local_d28);
              ::std::operator<<(poVar7,"\n");
              ::std::__cxx11::string::~string(local_d28);
              if (warn != (string *)0x0) {
                ::std::__cxx11::ostringstream::str();
                ::std::operator+(local_d48,local_d68);
                ::std::__cxx11::string::operator=((string *)warn,(string *)local_d48);
                ::std::__cxx11::string::~string((string *)local_d48);
                ::std::__cxx11::string::~string((string *)local_d68);
              }
              ::std::__cxx11::ostringstream::~ostringstream(local_d08);
            }
          }
        }
      }
      else {
joined_r0x002b94cc:
        if (__range2._4_4_ != 3) goto LAB_002b9b3b;
      }
      ::std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>
      ::operator++(&__end2);
    }
    spec_local._7_1_ = 1;
  }
  else {
    spec_local._7_1_ = 0;
  }
LAB_002b9b3b:
  ::std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_70);
  return (bool)(spec_local._7_1_ & 1);
}

Assistant:

bool ReconstructPrim<DiskLight>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    DiskLight *light,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {

  (void)references;
  (void)options;

  std::set<std::string> table;

  if (!prim::ReconstructXformOpsFromProperties(spec, table, properties, &light->xformOps, err)) {
    return false;
  }

  for (const auto &prop : properties) {
    // PARSE_PROPERTY(prop, "inputs:colorTemperature", light->colorTemperature)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:radius", DiskLight, light->radius)
    PARSE_EXTENT_ATTRIBUTE(table, prop, kExtent, DiskLight, light->extent)
    PARSE_TIMESAMPLED_ENUM_PROPERTY(table, prop, kVisibility, Visibility, VisibilityEnumHandler, DiskLight,
                       light->visibility, options.strict_allowedToken_check)
    PARSE_UNIFORM_ENUM_PROPERTY(table, prop, kPurpose, Purpose, PurposeEnumHandler, DiskLight,
                       light->purpose, options.strict_allowedToken_check)
    ADD_PROPERTY(table, prop, DiskLight, light->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }

  return true;
}